

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvector_serial.c
# Opt level: O0

int N_VEnableLinearCombination_Serial(N_Vector v,int tf)

{
  int tf_local;
  N_Vector v_local;
  
  if (v == (N_Vector)0x0) {
    v_local._4_4_ = -1;
  }
  else if (v->ops == (_generic_N_Vector_Ops *)0x0) {
    v_local._4_4_ = -1;
  }
  else {
    if (tf == 0) {
      v->ops->nvlinearcombination = (_func_int_int_realtype_ptr_N_Vector_ptr_N_Vector *)0x0;
    }
    else {
      v->ops->nvlinearcombination = N_VLinearCombination_Serial;
    }
    v_local._4_4_ = 0;
  }
  return v_local._4_4_;
}

Assistant:

int N_VEnableLinearCombination_Serial(N_Vector v, booleantype tf)
{
  /* check that vector is non-NULL */
  if (v == NULL) return(-1);

  /* check that ops structure is non-NULL */
  if (v->ops == NULL) return(-1);

  /* enable/disable operation */
  if (tf)
    v->ops->nvlinearcombination = N_VLinearCombination_Serial;
  else
    v->ops->nvlinearcombination = NULL;

  /* return success */
  return(0);
}